

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O0

Photon * __thiscall Light::emitPhoton(Light *this)

{
  double dVar1;
  int iVar2;
  long in_RSI;
  Photon *in_RDI;
  double in_stack_00000008;
  double in_stack_00000010;
  Light *in_stack_00000018;
  Vector3 P;
  double y;
  double x;
  Photon *photon;
  Photon *pPVar3;
  Photon *this_00;
  Vector3 local_68;
  undefined1 local_39;
  Vector3 local_38;
  double local_20;
  double local_18;
  
  pPVar3 = in_RDI;
  iVar2 = rand();
  this_00 = (Photon *)0x3ff0000000000000;
  local_18 = 1.0 - ((double)iVar2 + (double)iVar2) / 2147483647.0;
  iVar2 = rand();
  local_20 = (double)this_00 - ((double)iVar2 + (double)iVar2) / 2147483647.0;
  getPos(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  local_39 = 0;
  Photon::Photon(this_00);
  (in_RDI->ray).O.z = local_38.z;
  (in_RDI->ray).O.x = local_38.x;
  (in_RDI->ray).O.y = local_38.y;
  (in_RDI->flux).z = *(double *)(in_RSI + 0x60);
  dVar1 = *(double *)(in_RSI + 0x58);
  (in_RDI->flux).x = *(double *)(in_RSI + 0x50);
  (in_RDI->flux).y = dVar1;
  Vector3::randomVector();
  (in_RDI->ray).V.x = local_68.x;
  (in_RDI->ray).V.y = local_68.y;
  (in_RDI->ray).V.z = local_68.z;
  Vector3::~Vector3(&local_68);
  local_39 = 1;
  Vector3::~Vector3(&local_38);
  return pPVar3;
}

Assistant:

Photon Light::emitPhoton() const
{
    double x = 1 - rand() * 2. / RAND_MAX;
    double y = 1 - rand() * 2. / RAND_MAX;
    Vector3 P = getPos(x, y);
    Photon photon;
    photon.ray.O = P;
    photon.flux = color;// / color.power();
    //return photon.diffused(P, Dx.cross(Dy).normalized()* (rand() % 2 ? 1 : -1));
    photon.ray.V = Vector3::randomVector();
    return photon;
}